

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::add_then_stmt(IfStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  initializer_list<kratos::IRNode_*> __l;
  StatementType SVar1;
  element_type *this_00;
  StmtException *this_01;
  StmtBlock *this_02;
  allocator<kratos::IRNode_*> local_81;
  IfStmt *local_80;
  IfStmt **local_78;
  size_type local_70;
  vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  shared_ptr<kratos::Stmt> *local_18;
  shared_ptr<kratos::Stmt> *stmt_local;
  IfStmt *this_local;
  
  local_18 = stmt;
  stmt_local = (shared_ptr<kratos::Stmt> *)this;
  this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)stmt);
  SVar1 = Stmt::type(this_00);
  if (SVar1 == Block) {
    this_01 = (StmtException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"cannot add statement block to the if statement body",&local_39);
    local_78 = &local_80;
    local_70 = 1;
    local_80 = this;
    std::allocator<kratos::IRNode_*>::allocator(&local_81);
    __l._M_len = local_70;
    __l._M_array = (iterator)local_78;
    std::vector<kratos::IRNode_*,_std::allocator<kratos::IRNode_*>_>::vector
              (&local_68,__l,&local_81);
    StmtException::StmtException(this_01,&local_38,&local_68);
    __cxa_throw(this_01,&StmtException::typeinfo,StmtException::~StmtException);
  }
  this_02 = &std::
             __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->then_body_)->super_StmtBlock;
  StmtBlock::add_stmt(this_02,local_18);
  return;
}

Assistant:

void IfStmt::add_then_stmt(const std::shared_ptr<Stmt> &stmt) {
    if (stmt->type() == StatementType::Block)
        throw StmtException("cannot add statement block to the if statement body", {this});
    then_body_->add_stmt(stmt);
}